

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O2

int katherine_get_readout_temperature(katherine_device_t *device,float *temperature)

{
  undefined4 in_EAX;
  int iVar1;
  char crd [8];
  
  crd._0_4_ = in_EAX;
  iVar1 = katherine_cmd6(&device->control_socket,'\x15');
  if (iVar1 == 0) {
    iVar1 = katherine_cmd_wait_ack_crd(&device->control_socket,crd);
    if (iVar1 == 0) {
      *temperature = (float)crd._0_4_;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
katherine_get_readout_temperature(katherine_device_t *device, float *temperature)
{
    int res;

    res = katherine_cmd_get_readout_temperature(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    *temperature = *(float*) crd;
    return 0;

err:
    return res;
}